

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,postfix_expression *e)

{
  token_type tVar1;
  expression *e_00;
  wostream *os;
  value local_260;
  wstring local_238 [32];
  wstring_view local_218;
  wostringstream local_208 [8];
  wostringstream _woss;
  double local_90;
  double num;
  value local_78;
  double local_50;
  double orig;
  value member;
  postfix_expression *e_local;
  impl *this_local;
  
  member.field_1._24_8_ = e;
  e_00 = postfix_expression::e(e);
  eval((value *)&orig,this,e_00);
  get_value(&local_78,this,(value *)&orig);
  local_90 = to_number(&local_78);
  value::~value(&local_78);
  local_50 = local_90;
  tVar1 = postfix_expression::op((postfix_expression *)member.field_1._24_8_);
  if (tVar1 == plusplus) {
    local_90 = local_90 + 1.0;
  }
  else {
    if (tVar1 != minusminus) {
      std::__cxx11::wostringstream::wostringstream(local_208);
      os = std::operator<<((wostream *)local_208,"Not implemented: ");
      tVar1 = postfix_expression::op((postfix_expression *)member.field_1._24_8_);
      mjs::operator<<(os,tVar1);
      std::__cxx11::wostringstream::str();
      local_218 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_238)
      ;
      throw_runtime_error(&local_218,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                          ,0x265);
    }
    local_90 = local_90 - 1.0;
  }
  value::value(&local_260,local_90);
  put_value(this,(value *)&orig,&local_260);
  value::~value(&local_260);
  value::value(__return_storage_ptr__,local_50);
  value::~value((value *)&orig);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const postfix_expression& e) {
        auto member = eval(e.e());
        auto orig = to_number(get_value(member));
        auto num = orig;
        switch (e.op()) {
        case token_type::plusplus:   num += 1; break;
        case token_type::minusminus: num -= 1; break;
        default: NOT_IMPLEMENTED(e.op());
        }
        put_value(member, value{num});
        return value{orig};
    }